

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

uchar * __thiscall
kj::Vector<unsigned_char>::add<unsigned_char>(Vector<unsigned_char> *this,uchar *params)

{
  uchar *puVar1;
  
  puVar1 = (this->builder).pos;
  if (puVar1 == (this->builder).endPtr) {
    grow(this,0);
    puVar1 = (this->builder).pos;
  }
  *puVar1 = *params;
  puVar1 = (this->builder).pos;
  (this->builder).pos = puVar1 + 1;
  return puVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }